

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextWrappedV(char *fmt,__va_list_tag *args)

{
  float *pfVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  __va_list_tag *in_RDI;
  char *unaff_retaddr;
  bool need_backup;
  ImGuiWindow *window;
  undefined4 in_stack_ffffffffffffffe4;
  float wrap_pos_x;
  
  pIVar3 = GetCurrentWindow();
  pfVar1 = &(pIVar3->DC).TextWrapPos;
  bVar2 = *pfVar1 <= 0.0 && *pfVar1 != 0.0;
  wrap_pos_x = (float)CONCAT13(bVar2,(int3)in_stack_ffffffffffffffe4);
  if (bVar2) {
    PushTextWrapPos(wrap_pos_x);
  }
  TextV(unaff_retaddr,in_RDI);
  if (((uint)wrap_pos_x & 0x1000000) != 0) {
    PopTextWrapPos();
  }
  return;
}

Assistant:

void ImGui::TextWrappedV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    bool need_backup = (window->DC.TextWrapPos < 0.0f);  // Keep existing wrap position if one is already set
    if (need_backup)
        PushTextWrapPos(0.0f);
    TextV(fmt, args);
    if (need_backup)
        PopTextWrapPos();
}